

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O1

void r8_factorial_log_values(int *n_data,int *n,double *fn)

{
  int iVar1;
  
  if (*n_data < 0) {
    *n_data = 0;
  }
  if ((long)*n_data < 0x1b) {
    *n = *(int *)(&DAT_0022b310 + (long)*n_data * 4);
    iVar1 = *n_data;
    *fn = *(double *)(&DAT_0022b230 + (long)iVar1 * 8);
    *n_data = iVar1 + 1;
  }
  else {
    *n_data = 0;
    *n = 0;
    *fn = 0.0;
  }
  return;
}

Assistant:

void r8_factorial_log_values ( int *n_data, int *n, double *fn )

//****************************************************************************80
//
//  Purpose:
//
//    R8_FACTORIAL_LOG_VALUES returns values of log(factorial(n)).
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    09 May 2003
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Daniel Zwillinger, editor,
//    CRC Standard Mathematical Tables and Formulae,
//    30th Edition,
//    CRC Press, 1996.
//
//  Parameters:
//
//    Input/output, int *N_DATA.
//    On input, if N_DATA is 0, the first test data is returned, and N_DATA
//    is set to the index of the test data.  On each subsequent call, N_DATA is
//    incremented and that test data is returned.  When there is no more
//    test data, N_DATA is set to 0.
//
//    Output, int *N, the argument of the function.
//
//    Output, double *FN, the value of the function.
//
{
# define N_MAX 27

  double fnvec[N_MAX] = {
      0.0,         0.0,       0.6931472,  1.791757, 
      3.178051,    4.787489,  6.579246,   8.525160, 
     10.60460,    12.80182,  15.10441,   17.50232,   
     19.98722,    22.55216,  25.19123,   27.89927, 
     30.67186,    33.50508,  36.39544,   39.33987, 
     42.33561,    58.00362, 148.4778,   363.7394, 
    605.0201,   2611.331,   5912.128 };
  int nvec[N_MAX] = {
     0,   1,    2,   3, 
     4,   5,    6,   7, 
     8,   9,   10,  11, 
    12,  13,   14,  15, 
    16,  17,   18,  19, 
    20,  25,   50, 100, 
   150, 500, 1000 };

  if ( *n_data < 0 )
  {
    *n_data = 0;
  }

  if ( N_MAX <= *n_data )
  {
    *n_data = 0;
    *n = 0;
    *fn = 0.0;
  }
  else
  {
    *n = nvec[*n_data];
    *fn = fnvec[*n_data];
    *n_data = *n_data + 1;
  }

  return;

# undef N_MAX
}